

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void * __thiscall Logger::async_write(Logger *this)

{
  code *pcVar1;
  bool bVar2;
  char *__s;
  byte local_52;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lck;
  undefined1 local_30 [8];
  string single_line;
  Logger *this_local;
  
  single_line.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  while( true ) {
    bVar2 = buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pop(this->l_buffer_queue,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    local_52 = 0;
    if (bVar2) {
      bVar2 = std::atomic::operator_cast_to_bool((atomic *)&this->is_thread_stop);
      local_52 = bVar2 ^ 0xff;
    }
    if ((local_52 & 1) == 0) break;
    std::lock_guard<std::mutex>::lock_guard(&local_48,&this->l_mutex);
    __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    fputs(__s,(FILE *)this->l_fp);
    std::lock_guard<std::mutex>::~lock_guard(&local_48);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void *async_write()
    {
        string single_line;
        //@ assuming that no thread pushes elements in, once async writing thread starts, it falls in sleep
        //  and will never be awaken. To deal with that, an interface "notify" is introduced in buffer_queue.
        //  In destruction func, notify is called to wake up this thread and let it stop naturally.
        //@ assuming that pop func returns false under spurious wakeup, the loop will be over as well as the async writing thread,
        //  which is not what we expected. So the variable is_thread_stop is introduced. Only in destruction func will it be setted,
        //  combining with the notify func, the thread can finish normally. Anothor function of is_thread_stop is to terminate the
        // busy loop of pushing operation in write_log func when this class comes to end.
        while(l_buffer_queue->pop(single_line) && !is_thread_stop)
        {
            lock_guard<mutex> lck (l_mutex);
            fputs(single_line.c_str(), l_fp); 
        }   
    }